

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

int GetThreadPriority(HANDLE hThread)

{
  int local_20;
  PAL_ERROR local_1c;
  int iPriority;
  PAL_ERROR palError;
  CPalThread *pThread;
  HANDLE hThread_local;
  
  local_20 = 0x7fffffff;
  pThread = (CPalThread *)hThread;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  _iPriority = CorUnix::InternalGetCurrentThread();
  local_1c = CorUnix::InternalGetThreadPriority(_iPriority,pThread,&local_20);
  if (local_1c != 0) {
    CorUnix::CPalThread::SetLastError(local_1c);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_20;
}

Assistant:

int
PALAPI
GetThreadPriority(
          IN HANDLE hThread)
{
    CPalThread *pThread;
    PAL_ERROR palError;
    int iPriority = THREAD_PRIORITY_ERROR_RETURN;

    PERF_ENTRY(GetThreadPriority);
    ENTRY("GetThreadPriority(hThread=%p)\n", hThread);

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadPriority(
        pThread,
        hThread,
        &iPriority
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("GetThreadPriorityExit returns int %d\n", iPriority);
    PERF_EXIT(GetThreadPriority);

    return iPriority;
}